

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_open_address_hash.c
# Opt level: O2

void test_open_address_hashmap_update_2(planck_unit_test_t *tc)

{
  planck_unit_result_t pVar1;
  ion_err_t iVar2;
  ion_status_t iVar3;
  char *pcVar4;
  ulong uVar5;
  uint local_78;
  char str [10];
  ion_hashmap_t map;
  
  initialize_hash_map_std_conditions(&map);
  map.write_concern = '\x01';
  pVar1 = planck_unit_assert_true
                    (tc,1,0x2bd,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                     ,"condition was false, expected true");
  if (pVar1 != '\0') {
    uVar5 = 0;
    while( true ) {
      local_78 = (uint)uVar5;
      if (map.map_size / 2 <= (int)local_78) break;
      sprintf(str,"%02i is key",uVar5);
      iVar3 = oah_insert(&map,&local_78,str);
      pVar1 = planck_unit_assert_true
                        (tc,(uint)(iVar3.error == '\0'),0x2c6,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                         ,"condition was false, expected true");
      if (pVar1 == '\0') goto LAB_00102da1;
      pVar1 = planck_unit_assert_true
                        (tc,(uint)(((ulong)iVar3 & 0xffffffff00000000) == 0x100000000),0x2c7,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                         ,"condition was false, expected true");
      if (pVar1 == '\0') goto LAB_00102da1;
      uVar5 = (ulong)(local_78 + 1);
    }
    local_78 = 0;
    while( true ) {
      if (map.map_size / 2 <= (int)local_78) break;
      pcVar4 = (char *)malloc(10);
      iVar3 = oah_get(&map,&local_78,pcVar4);
      pVar1 = planck_unit_assert_true
                        (tc,(uint)(iVar3.error == '\0'),0x2d0,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                         ,"condition was false, expected true");
      if (pVar1 == '\0') goto LAB_00102da1;
      pVar1 = planck_unit_assert_true
                        (tc,(uint)(((ulong)iVar3 & 0xffffffff00000000) == 0x100000000),0x2d1,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                         ,"condition was false, expected true");
      if (pVar1 == '\0') goto LAB_00102da1;
      sprintf(str,"%02i is key",(ulong)local_78);
      pVar1 = planck_unit_assert_str_are_equal
                        (tc,pcVar4,str,0x2d7,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                        );
      if (pVar1 == '\0') goto LAB_00102da1;
      free(pcVar4);
      local_78 = local_78 + 1;
    }
    for (local_78 = 0; (int)local_78 < map.map_size; local_78 = local_78 + 1) {
      sprintf(str,"%02i is new");
      iVar3 = oah_update(&map,&local_78,str);
      pVar1 = planck_unit_assert_true
                        (tc,(uint)(iVar3.error == '\0'),0x2e6,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                         ,"condition was false, expected true");
      if (pVar1 == '\0') goto LAB_00102da1;
      pVar1 = planck_unit_assert_true
                        (tc,(uint)(((ulong)iVar3 & 0xffffffff00000000) == 0x100000000),0x2e7,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                         ,"condition was false, expected true");
      if (pVar1 == '\0') goto LAB_00102da1;
    }
    for (local_78 = 0; (int)local_78 < map.map_size; local_78 = local_78 + 1) {
      pcVar4 = (char *)malloc(10);
      iVar3 = oah_get(&map,&local_78,pcVar4);
      pVar1 = planck_unit_assert_true
                        (tc,(uint)(iVar3.error == '\0'),0x2f0,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                         ,"condition was false, expected true");
      if (pVar1 == '\0') goto LAB_00102da1;
      pVar1 = planck_unit_assert_true
                        (tc,(uint)(((ulong)iVar3 & 0xffffffff00000000) == 0x100000000),0x2f1,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                         ,"condition was false, expected true");
      if (pVar1 == '\0') goto LAB_00102da1;
      sprintf(str,"%02i is new",(ulong)local_78);
      pVar1 = planck_unit_assert_str_are_equal
                        (tc,pcVar4,str,0x2f7,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                        );
      if (pVar1 == '\0') goto LAB_00102da1;
      free(pcVar4);
    }
    iVar2 = oah_destroy(&map);
    pVar1 = planck_unit_assert_true
                      (tc,(uint)(iVar2 == '\0'),0x2fe,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                       ,"condition was false, expected true");
    if (pVar1 != '\0') {
      return;
    }
  }
LAB_00102da1:
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
test_open_address_hashmap_update_2(
	planck_unit_test_t *tc
) {
	ion_hashmap_t	map;							/* create handler for hashmap */
	int				i;
	ion_status_t	status;

	initialize_hash_map_std_conditions(&map);

	/* change write concern to allow up updates */
	map.write_concern = wc_insert_unique;

	/* check to make sure that the write concern is set to wc_insert_unique (default) */
	PLANCK_UNIT_ASSERT_TRUE(tc, wc_insert_unique == map.write_concern);

	/* populate the map to only half capacity to make sure there is room */
	for (i = 0; i < (map.map_size / 2); i++) {
		/* build up the value */
		char str[10];

		sprintf(str, "%02i is key", i);
		status = oah_insert(&map, (&i), str);
		PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
		PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);
	}

	/* check status of <K,V> */
	for (i = 0; i < map.map_size / 2; i++) {
		ion_value_t value;

		value	= malloc(10);
		status	= oah_get(&map, &i, value);
		PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
		PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);

		/* build up expected value */
		char str[10];

		sprintf(str, "%02i is key", i);
		PLANCK_UNIT_ASSERT_STR_ARE_EQUAL(tc, (char *) value, str);

		if (value != NULL) {
			/* must free value after query */
			free(value);
		}
	}

	/*and update the values for the known keys */
	for (i = 0; i < (map.map_size); i++) {
		/* build up the value */
		char str[10];

		sprintf(str, "%02i is new", i);
		status = oah_update(&map, (&i), str);
		PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
		PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);
	}

	/* and check updated status of <K,V> */
	for (i = 0; i < map.map_size; i++) {
		ion_value_t value;

		value	= malloc(10);
		status	= oah_get(&map, &i, value);
		PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
		PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);

		/* build up expected value */
		char str[10];

		sprintf(str, "%02i is new", i);
		PLANCK_UNIT_ASSERT_STR_ARE_EQUAL(tc, (char *) value, str);

		if (value != NULL) {
			free(value);
		}	/* must free value after query */
	}

	PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == oah_destroy(&map));
}